

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidateDocumentFinal(xmlValidCtxtPtr ctxt,xmlDocPtr doc)

{
  xmlHashTablePtr hash;
  undefined8 local_38;
  xmlParserInputPtr oldInput;
  xmlParserCtxtPtr pctxt;
  xmlRefTablePtr table;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  oldInput = (xmlParserInputPtr)0x0;
  local_38 = 0;
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else if (doc == (xmlDocPtr)0x0) {
    xmlErrValid(ctxt,XML_DTD_NO_DOC,"xmlValidateDocumentFinal: doc == NULL\n",(char *)0x0);
    ctxt_local._4_4_ = 0;
  }
  else {
    if ((ctxt->flags & 2) != 0) {
      oldInput = (xmlParserInputPtr)ctxt->userData;
      local_38 = *(undefined8 *)&oldInput->col;
      *(undefined8 *)&oldInput->col = 0;
    }
    hash = (xmlHashTablePtr)doc->refs;
    ctxt->doc = doc;
    ctxt->valid = 1;
    xmlHashScan(hash,xmlValidateCheckRefCallback,ctxt);
    if ((ctxt->flags & 2) != 0) {
      *(undefined8 *)&oldInput->col = local_38;
    }
    ctxt_local._4_4_ = ctxt->valid;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlValidateDocumentFinal(xmlValidCtxtPtr ctxt, xmlDocPtr doc) {
    xmlRefTablePtr table;
    xmlParserCtxtPtr pctxt = NULL;
    xmlParserInputPtr oldInput = NULL;

    if (ctxt == NULL)
        return(0);
    if (doc == NULL) {
        xmlErrValid(ctxt, XML_DTD_NO_DOC,
		"xmlValidateDocumentFinal: doc == NULL\n", NULL);
	return(0);
    }

    /*
     * Check all the NOTATION/NOTATIONS attributes
     */
    /*
     * Check all the ENTITY/ENTITIES attributes definition for validity
     */
    /*
     * Check all the IDREF/IDREFS attributes definition for validity
     */

    /*
     * Don't print line numbers.
     */
    if (ctxt->flags & XML_VCTXT_USE_PCTXT) {
        pctxt = ctxt->userData;
        oldInput = pctxt->input;
        pctxt->input = NULL;
    }

    table = (xmlRefTablePtr) doc->refs;
    ctxt->doc = doc;
    ctxt->valid = 1;
    xmlHashScan(table, xmlValidateCheckRefCallback, ctxt);

    if (ctxt->flags & XML_VCTXT_USE_PCTXT)
        pctxt->input = oldInput;

    return(ctxt->valid);
}